

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpinfo.c
# Opt level: O3

int GetBits(uint8_t *data,size_t data_size,size_t nb,int *val,uint64_t *bit_pos)

{
  ulong uVar1;
  int iVar2;
  
  *val = 0;
  if (nb != 0) {
    iVar2 = 0;
    uVar1 = *bit_pos;
    do {
      *bit_pos = uVar1 + 1;
      if (data_size <= uVar1 >> 3) {
        return 0;
      }
      iVar2 = (uint)((byte)(data[uVar1 >> 3] << ((byte)uVar1 & 7)) >> 7) + iVar2 * 2;
      *val = iVar2;
      nb = nb - 1;
      uVar1 = uVar1 + 1;
    } while (nb != 0);
  }
  return 1;
}

Assistant:

static int GetBits(const uint8_t* const data, size_t data_size, size_t nb,
                   int* val, uint64_t* const bit_pos) {
  *val = 0;
  while (nb-- > 0) {
    const uint64_t p = (*bit_pos)++;
    if ((p >> 3) >= data_size) {
      return 0;
    } else {
      const int bit = !!(data[p >> 3] & (128 >> ((p & 7))));
      *val = (*val << 1) | bit;
    }
  }
  return 1;
}